

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall TPZFMatrix<long>::TPZFMatrix(TPZFMatrix<long> *this,TPZFMatrix<long> *A)

{
  int64_t iVar1;
  long *plVar2;
  char cVar3;
  
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_0166a490;
  iVar1 = (A->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol = iVar1;
  cVar3 = (A->super_TPZMatrix<long>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDefPositive = cVar3;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01669328;
  plVar2 = A->fGiven;
  this->fElem = A->fElem;
  this->fGiven = plVar2;
  this->fSize = A->fSize;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,&A->fPivot);
  TPZVec<long>::TPZVec(&this->fWork,&A->fWork);
  A->fElem = (long *)0x0;
  A->fGiven = (long *)0x0;
  A->fSize = 0;
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(TPZFMatrix<TVar> &&A)
    : TPZMatrix<TVar>(A), fElem(A.fElem),
      fGiven(A.fGiven),fSize(A.fSize),
      fPivot(A.fPivot), fWork(A.fWork)
{
    A.fElem=nullptr;
    A.fGiven=nullptr;
    A.fSize=0;
}